

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

int64_t __thiscall fasttext::Vector::argmax(Vector *this)

{
  int64_t i;
  int64_t argmax;
  real max;
  Vector *this_local;
  
  max = *this->data_;
  argmax = 0;
  for (i = 1; i < this->m_; i = i + 1) {
    if (max < this->data_[i]) {
      max = this->data_[i];
      argmax = i;
    }
  }
  return argmax;
}

Assistant:

int64_t Vector::argmax() {
  real max = data_[0];
  int64_t argmax = 0;
  for (int64_t i = 1; i < m_; i++) {
    if (data_[i] > max) {
      max = data_[i];
      argmax = i;
    }
  }
  return argmax;
}